

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclShortNames(SC_Lib *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  SC_Cell *pClass_00;
  SC_Pin *p_00;
  long *plVar4;
  char *pcVar5;
  int nDigits2;
  int nDigits;
  int nClasses;
  int n;
  int k;
  int i;
  SC_Pin *pPin;
  SC_Cell *pCell;
  SC_Cell *pClass;
  char Buffer [10000];
  SC_Lib *p_local;
  
  uVar1 = Abc_SclLibClassNum(p);
  uVar1 = Abc_Base10Log(uVar1);
  for (n = 0; iVar2 = Vec_PtrSize(&p->vCellClasses), n < iVar2; n = n + 1) {
    pClass_00 = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,n);
    uVar3 = Abc_SclClassCellNum(pClass_00);
    uVar3 = Abc_Base10Log(uVar3);
    pPin = (SC_Pin *)pClass_00;
    for (nClasses = 0; nClasses == 0 || (SC_Cell *)pPin != pClass_00; nClasses = nClasses + 1) {
      if (pPin->pName != (char *)0x0) {
        free(pPin->pName);
        pPin->pName = (char *)0x0;
      }
      sprintf((char *)&pClass,"g%0*d_%0*d",(ulong)uVar1,(ulong)(uint)n,(ulong)uVar3,
              (ulong)(uint)nClasses);
      pcVar5 = Abc_UtilStrsav((char *)&pClass);
      pPin->pName = pcVar5;
      for (nDigits = (pPin->vRTimings).nCap; iVar2 = Vec_PtrSize((Vec_Ptr_t *)&pPin->vFunc),
          nDigits < iVar2; nDigits = nDigits + 1) {
        p_00 = (SC_Pin *)Vec_PtrEntry((Vec_Ptr_t *)&pPin->vFunc,nDigits);
        Abc_SclPinUpdate((SC_Cell *)pPin,p_00,(char *)&pClass);
      }
      for (nDigits = 0; nDigits < (pPin->vRTimings).nCap; nDigits = nDigits + 1) {
        plVar4 = (long *)Vec_PtrEntry((Vec_Ptr_t *)&pPin->vFunc,nDigits);
        if (*plVar4 != 0) {
          free((void *)*plVar4);
          *plVar4 = 0;
        }
        sprintf((char *)&pClass,"%c",(ulong)(nDigits + 0x61));
        pcVar5 = Abc_UtilStrsav((char *)&pClass);
        *plVar4 = (long)pcVar5;
      }
      for (nDigits = (pPin->vRTimings).nCap; iVar2 = Vec_PtrSize((Vec_Ptr_t *)&pPin->vFunc),
          nDigits < iVar2; nDigits = nDigits + 1) {
        plVar4 = (long *)Vec_PtrEntry((Vec_Ptr_t *)&pPin->vFunc,nDigits);
        if (*plVar4 != 0) {
          free((void *)*plVar4);
          *plVar4 = 0;
        }
        sprintf((char *)&pClass,"%c",(ulong)(uint)((0x7a - nDigits) + (pPin->vRTimings).nCap));
        pcVar5 = Abc_UtilStrsav((char *)&pClass);
        *plVar4 = (long)pcVar5;
      }
      pPin = (SC_Pin *)(pPin->vRTimings).pArray;
    }
  }
  p->nBins = 0;
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  Abc_SclHashCells(p);
  pcVar5 = p->pName;
  uVar1 = SC_LibCellNum(p);
  printf("Renaming library \"%s\" into \"%s%d\".\n",pcVar5,"lib",(ulong)uVar1);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  uVar1 = SC_LibCellNum(p);
  sprintf((char *)&pClass,"lib%d",(ulong)uVar1);
  pcVar5 = Abc_UtilStrsav((char *)&pClass);
  p->pName = pcVar5;
  return;
}

Assistant:

void Abc_SclShortNames( SC_Lib * p )
{
    char Buffer[10000];
    SC_Cell * pClass, * pCell; SC_Pin * pPin;
    int i, k, n, nClasses = Abc_SclLibClassNum(p);
    int nDigits = Abc_Base10Log( nClasses );
    // itereate through classes
    SC_LibForEachCellClass( p, pClass, i )
    {
        int nDigits2 = Abc_Base10Log( Abc_SclClassCellNum(pClass) );
        SC_RingForEachCell( pClass, pCell, k )
        {
            ABC_FREE( pCell->pName );
            sprintf( Buffer, "g%0*d_%0*d", nDigits, i, nDigits2, k );
            pCell->pName = Abc_UtilStrsav( Buffer );
            // formula
            SC_CellForEachPinOut( pCell, pPin, n )
                Abc_SclPinUpdate( pCell, pPin, Buffer );
            // pin names
            SC_CellForEachPinIn( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'a'+n );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
            SC_CellForEachPinOut( pCell, pPin, n )
            {
                ABC_FREE( pPin->pName );
                sprintf( Buffer, "%c", 'z'-n+pCell->n_inputs );
                pPin->pName = Abc_UtilStrsav( Buffer );
            }
        }
    }
    p->nBins = 0;
    ABC_FREE( p->pBins );
    Abc_SclHashCells( p );
    // update library name
    printf( "Renaming library \"%s\" into \"%s%d\".\n", p->pName, "lib", SC_LibCellNum(p) );
    ABC_FREE( p->pName );
    sprintf( Buffer, "lib%d", SC_LibCellNum(p) );
    p->pName = Abc_UtilStrsav( Buffer );
}